

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

size_t __thiscall
Diligent::Serializer<(Diligent::SerializerMode)2>::GetSize
          (Serializer<(Diligent::SerializerMode)2> *this)

{
  char (*pacVar1) [17];
  char (*Args_1) [17];
  string msg;
  string local_30;
  
  Args_1 = (char (*) [17])this->m_Start;
  pacVar1 = (char (*) [17])this->m_Ptr;
  if (pacVar1 < Args_1) {
    FormatString<char[26],char[17]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_Ptr >= m_Start",
               Args_1);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x10b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    Args_1 = (char (*) [17])this->m_Start;
    pacVar1 = (char (*) [17])this->m_Ptr;
  }
  return (long)pacVar1 - (long)Args_1;
}

Assistant:

size_t GetSize() const
    {
        VERIFY_EXPR(m_Ptr >= m_Start);
        return m_Ptr - m_Start;
    }